

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::next_byte_in_range
          (lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this,initializer_list<int> ranges)

{
  int *piVar1;
  int *piVar2;
  char cVar3;
  
  piVar2 = ranges._M_array;
  cVar3 = (char)this + '8';
  std::__cxx11::string::push_back(cVar3);
  if (ranges._M_len != 0) {
    piVar1 = piVar2 + ranges._M_len;
    do {
      get(this);
      if ((this->current < *piVar2) || (piVar2[1] < this->current)) {
        this->error_message = "invalid string: ill-formed UTF-8 byte";
        return false;
      }
      std::__cxx11::string::push_back(cVar3);
      piVar2 = piVar2 + 2;
    } while (piVar2 != piVar1);
  }
  return true;
}

Assistant:

bool next_byte_in_range(std::initializer_list<int> ranges)
    {
        assert(ranges.size() == 2 or ranges.size() == 4 or ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_LIKELY(*range <= current and current <= *(++range)))
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }